

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O0

void __thiscall soul::WaveGenerators::Blep::~Blep(Blep *this)

{
  code *pcVar1;
  Blep *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

double blep (double phase)
        {
            if (phase < phaseIncrement)
            {
                phase = phase / phaseIncrement;
                return (phase + phase) - (phase * phase) - 1.0f;
            }

            if (phase > (1.0f - phaseIncrement))
            {
                phase = (phase - 1.0f) / phaseIncrement;
                return (phase * phase) + (phase + phase) + 1.0f;
            }

            return 0;
        }